

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::Configure(cmake *this)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  pointer pcVar4;
  pointer pcVar5;
  ulong uVar6;
  string *var;
  bool local_3a1;
  bool local_339;
  allocator<char> local_271;
  string local_270;
  cmValue local_250;
  cmValue delCacheVars;
  int ret;
  string *local_220;
  allocator<char> local_211;
  string local_210;
  string *local_1f0;
  allocator<char> local_1e1;
  string local_1e0;
  string *local_1c0;
  allocator<char> local_1b1;
  string local_1b0;
  cmValue local_190;
  cmValue value;
  key_type local_180;
  allocator<char> local_159;
  string local_158;
  cmValue local_138;
  cmValue cachedErrorDeprecated;
  string local_128;
  cmValue local_108;
  cmValue cachedWarnDeprecated;
  undefined1 local_f8 [6];
  bool setDeprecatedVariables;
  allocator<char> local_d1;
  key_type local_d0;
  allocator<char> local_a9;
  key_type local_a8;
  mapped_type local_88;
  allocator<char> local_81;
  DiagLevel diagLevel;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  optional<cmMakefileProfilingData::RAII> profilingRAII;
  cmake *this_local;
  
  profilingRAII.super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
  super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
  super__Optional_payload_base<cmMakefileProfilingData::RAII>._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"project",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&diagLevel,"configure",&local_81);
  CreateProfilingEntry((cmake *)local_28,(string *)this,&local_48);
  std::__cxx11::string::~string((string *)&diagLevel);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"deprecated",&local_a9);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(&this->DiagLevels,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  if (sVar2 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"deprecated",&local_d1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](&this->DiagLevels,&local_d0);
    local_88 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    if (local_88 == DIAG_IGNORE) {
      SetSuppressDeprecatedWarnings(this,true);
      SetDeprecatedWarningsAsErrors(this,false);
    }
    else if (local_88 == DIAG_WARN) {
      SetSuppressDeprecatedWarnings(this,false);
      SetDeprecatedWarningsAsErrors(this,false);
    }
    else if (local_88 == DIAG_ERROR) {
      SetSuppressDeprecatedWarnings(this,false);
      SetDeprecatedWarningsAsErrors(this,true);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"dev",(allocator<char> *)((long)&cachedWarnDeprecated.Value + 7));
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
          ::count(&this->DiagLevels,(key_type *)local_f8);
  std::__cxx11::string::~string((string *)local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cachedWarnDeprecated.Value + 7));
  if (sVar2 == 1) {
    cachedWarnDeprecated.Value._6_1_ = 0;
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"CMAKE_WARN_DEPRECATED",
               (allocator<char> *)((long)&cachedErrorDeprecated.Value + 7));
    local_108 = cmState::GetCacheEntryValue(pcVar4,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cachedErrorDeprecated.Value + 7));
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"CMAKE_ERROR_DEPRECATED",&local_159);
    local_138 = cmState::GetCacheEntryValue(pcVar4,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    bVar1 = cmValue::operator_cast_to_bool(&local_108);
    if ((!bVar1) && (bVar1 = cmValue::operator_cast_to_bool(&local_138), !bVar1)) {
      cachedWarnDeprecated.Value._6_1_ = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"dev",(allocator<char> *)((long)&value.Value + 7));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
             ::operator[](&this->DiagLevels,&local_180);
    local_88 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value.Value + 7));
    if (local_88 == DIAG_IGNORE) {
      SetSuppressDevWarnings(this,true);
      SetDevWarningsAsErrors(this,false);
      if ((cachedWarnDeprecated.Value._6_1_ & 1) != 0) {
        SetSuppressDeprecatedWarnings(this,true);
        SetDeprecatedWarningsAsErrors(this,false);
      }
    }
    else if (local_88 == DIAG_WARN) {
      SetSuppressDevWarnings(this,false);
      SetDevWarningsAsErrors(this,false);
      if ((cachedWarnDeprecated.Value._6_1_ & 1) != 0) {
        SetSuppressDeprecatedWarnings(this,false);
        SetDeprecatedWarningsAsErrors(this,false);
      }
    }
    else if (local_88 == DIAG_ERROR) {
      SetSuppressDevWarnings(this,false);
      SetDevWarningsAsErrors(this,true);
      if ((cachedWarnDeprecated.Value._6_1_ & 1) != 0) {
        SetSuppressDeprecatedWarnings(this,false);
        SetDeprecatedWarningsAsErrors(this,true);
      }
    }
  }
  pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"CMAKE_WARN_DEPRECATED",&local_1b1);
  local_190 = cmState::GetCacheEntryValue(pcVar4,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  pcVar5 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                     (&this->Messenger);
  bVar1 = cmValue::operator_cast_to_bool(&local_190);
  local_339 = false;
  if (bVar1) {
    local_339 = cmValue::IsOff(&local_190);
  }
  cmMessenger::SetSuppressDeprecatedWarnings(pcVar5,local_339);
  pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"CMAKE_ERROR_DEPRECATED",&local_1e1);
  local_1c0 = (string *)cmState::GetCacheEntryValue(pcVar4,&local_1e0);
  local_190 = (cmValue)local_1c0;
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  pcVar5 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                     (&this->Messenger);
  bVar1 = cmValue::IsOn(&local_190);
  cmMessenger::SetDeprecatedWarningsAsErrors(pcVar5,bVar1);
  pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_211);
  local_1f0 = (string *)cmState::GetCacheEntryValue(pcVar4,&local_210);
  local_190 = (cmValue)local_1f0;
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  pcVar5 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                     (&this->Messenger);
  bVar1 = cmValue::IsOn(&local_190);
  cmMessenger::SetSuppressDevWarnings(pcVar5,bVar1);
  pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",
             (allocator<char> *)((long)&delCacheVars.Value + 7));
  local_220 = (string *)cmState::GetCacheEntryValue(pcVar4,(string *)&ret);
  local_190 = (cmValue)local_220;
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator((allocator<char> *)((long)&delCacheVars.Value + 7));
  pcVar5 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                     (&this->Messenger);
  bVar1 = cmValue::operator_cast_to_bool(&local_190);
  local_3a1 = false;
  if (bVar1) {
    local_3a1 = cmValue::IsOff(&local_190);
  }
  cmMessenger::SetDevWarningsAsErrors(pcVar5,local_3a1);
  delCacheVars.Value._0_4_ = ActualConfigure(this);
  pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_271);
  local_250 = cmState::GetGlobalProperty(pcVar4,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  bVar1 = cmValue::operator_cast_to_bool(&local_250);
  if (bVar1) {
    cmValue::operator->[abi_cxx11_(&local_250);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      var = cmValue::operator*[abi_cxx11_(&local_250);
      this_local._4_4_ = HandleDeleteCacheVariables(this,var);
      goto LAB_005d7ef3;
    }
  }
  this_local._4_4_ = (int)delCacheVars.Value;
LAB_005d7ef3:
  std::optional<cmMakefileProfilingData::RAII>::~optional
            ((optional<cmMakefileProfilingData::RAII> *)local_28);
  return this_local._4_4_;
}

Assistant:

int cmake::Configure()
{
#if !defined(CMAKE_BOOTSTRAP)
  auto profilingRAII = this->CreateProfilingEntry("project", "configure");
#endif

  DiagLevel diagLevel;

  if (this->DiagLevels.count("deprecated") == 1) {

    diagLevel = this->DiagLevels["deprecated"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDeprecatedWarnings(true);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(false);
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDeprecatedWarnings(false);
      this->SetDeprecatedWarningsAsErrors(true);
    }
  }

  if (this->DiagLevels.count("dev") == 1) {
    bool setDeprecatedVariables = false;

    cmValue cachedWarnDeprecated =
      this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
    cmValue cachedErrorDeprecated =
      this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");

    // don't overwrite deprecated warning setting from a previous invocation
    if (!cachedWarnDeprecated && !cachedErrorDeprecated) {
      setDeprecatedVariables = true;
    }

    diagLevel = this->DiagLevels["dev"];
    if (diagLevel == DIAG_IGNORE) {
      this->SetSuppressDevWarnings(true);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(true);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_WARN) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(false);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(false);
      }
    } else if (diagLevel == DIAG_ERROR) {
      this->SetSuppressDevWarnings(false);
      this->SetDevWarningsAsErrors(true);

      if (setDeprecatedVariables) {
        this->SetSuppressDeprecatedWarnings(false);
        this->SetDeprecatedWarningsAsErrors(true);
      }
    }
  }

  // Cache variables may have already been set by a previous invocation,
  // so we cannot rely on command line options alone. Always ensure our
  // messenger is in sync with the cache.
  cmValue value = this->State->GetCacheEntryValue("CMAKE_WARN_DEPRECATED");
  this->Messenger->SetSuppressDeprecatedWarnings(value && value.IsOff());

  value = this->State->GetCacheEntryValue("CMAKE_ERROR_DEPRECATED");
  this->Messenger->SetDeprecatedWarningsAsErrors(value.IsOn());

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
  this->Messenger->SetSuppressDevWarnings(value.IsOn());

  value = this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_ERRORS");
  this->Messenger->SetDevWarningsAsErrors(value && value.IsOff());

  int ret = this->ActualConfigure();
  cmValue delCacheVars =
    this->State->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if (delCacheVars && !delCacheVars->empty()) {
    return this->HandleDeleteCacheVariables(*delCacheVars);
  }
  return ret;
}